

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

int wally_hex_from_bytes(uchar *bytes,size_t bytes_len,char **output)

{
  size_t sVar1;
  char *pcVar2;
  char **output_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  if ((bytes == (uchar *)0x0) || (output == (char **)0x0)) {
    bytes_local._4_4_ = -2;
  }
  else {
    sVar1 = hex_str_size(bytes_len);
    pcVar2 = (char *)wally_malloc(sVar1);
    *output = pcVar2;
    if (*output == (char *)0x0) {
      bytes_local._4_4_ = -3;
    }
    else {
      pcVar2 = *output;
      sVar1 = hex_str_size(bytes_len);
      hex_encode(bytes,bytes_len,pcVar2,sVar1);
      bytes_local._4_4_ = 0;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int wally_hex_from_bytes(const unsigned char *bytes, size_t bytes_len,
                         char **output)
{
    if (output)
        *output = NULL;

    if (!bytes || !output)
        return WALLY_EINVAL;

    *output = wally_malloc(hex_str_size(bytes_len));
    if (!*output)
        return WALLY_ENOMEM;

    /* Note we ignore the return value as this call cannot fail */
    hex_encode(bytes, bytes_len, *output, hex_str_size(bytes_len));
    return WALLY_OK;
}